

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O1

void __thiscall
double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  double dVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  BignumDtoaMode BVar8;
  int iVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  Bignum *pBVar14;
  int *piVar15;
  ulong factor;
  uint uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  float fVar18;
  Vector<char> buffer_00;
  Bignum delta_plus;
  Bignum delta_minus;
  Bignum denominator;
  Bignum numerator;
  undefined4 in_stack_fffffffffffff788;
  int iVar19;
  Bignum local_848;
  Bignum local_644;
  Bignum local_440;
  Bignum local_23c;
  long local_38;
  
  pcVar11 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar15 = buffer._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = (uint)this;
  if (uVar13 == 1) {
    fVar18 = (float)v;
    uVar10 = (uint)fVar18 & 0x7fffff;
    bVar17 = ((uint)fVar18 & 0x7f800000) == 0;
    uVar16 = uVar10 + 0x800000;
    if (bVar17) {
      uVar16 = uVar10;
    }
    factor = (ulong)uVar16;
    iVar9 = -0x95;
    if (!bVar17) {
      iVar9 = ((uint)fVar18 >> 0x17 & 0xff) - 0x96;
    }
    if (uVar10 != 0) goto LAB_003e8be8;
    bVar17 = ((uint)fVar18 & 0x7f000000) == 0;
LAB_003e8bff:
    bVar17 = !bVar17;
  }
  else {
    uVar12 = (ulong)v & 0xfffffffffffff;
    bVar17 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar12 + 0x10000000000000;
    if (bVar17) {
      factor = uVar12;
    }
    iVar9 = -0x432;
    if (!bVar17) {
      iVar9 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    if (uVar12 == 0) {
      bVar17 = ((ulong)v & 0x7fe0000000000000) == 0;
      goto LAB_003e8bff;
    }
LAB_003e8be8:
    bVar17 = false;
  }
  lVar1 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar4 = (iVar9 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar4 = iVar9;
  }
  dVar2 = ceil((double)(iVar4 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar16 = (uint)dVar2;
  if ((uVar13 == 2) && ((int)mode < (int)~uVar16)) {
    *pcVar11 = '\0';
    *piVar15 = 0;
    *length = -mode;
    goto LAB_003e90b9;
  }
  memset(&local_23c,0xaa,0x204);
  local_23c.used_bigits_ = 0;
  local_23c.exponent_ = 0;
  memset(&local_440,0xaa,0x204);
  local_440.used_bigits_ = 0;
  local_440.exponent_ = 0;
  memset(&local_644,0xaa,0x204);
  local_644.used_bigits_ = 0;
  local_644.exponent_ = 0;
  memset(&local_848,0xaa,0x204);
  local_848.used_bigits_ = 0;
  local_848.exponent_ = 0;
  if (iVar9 < 0) {
    if ((int)uVar16 < 0) {
      Bignum::AssignPowerUInt16(&local_23c,10,-uVar16);
      if (uVar13 < 2) {
        Bignum::AssignBignum(&local_848,&local_23c);
        Bignum::AssignBignum(&local_644,&local_23c);
        Bignum::MultiplyByUInt64(&local_23c,factor);
        pBVar14 = &local_440;
        Bignum::AssignUInt16(pBVar14,1);
        Bignum::ShiftLeft(pBVar14,-iVar9);
        Bignum::ShiftLeft(&local_23c,1);
        iVar9 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&local_23c,factor);
        pBVar14 = &local_440;
        Bignum::AssignUInt16(pBVar14,1);
        iVar9 = -iVar9;
      }
      goto LAB_003e8da2;
    }
    Bignum::AssignUInt64(&local_23c,factor);
    Bignum::AssignPowerUInt16(&local_440,10,uVar16);
    Bignum::ShiftLeft(&local_440,-iVar9);
    if (uVar13 < 2) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::AssignUInt16(&local_848,1);
      Bignum::AssignUInt16(&local_644,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_23c,factor);
    Bignum::ShiftLeft(&local_23c,iVar9);
    Bignum::AssignPowerUInt16(&local_440,10,uVar16);
    if (uVar13 < 2) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::AssignUInt16(&local_848,1);
      Bignum::ShiftLeft(&local_848,iVar9);
      pBVar14 = &local_644;
      Bignum::AssignUInt16(pBVar14,1);
LAB_003e8da2:
      Bignum::ShiftLeft(pBVar14,iVar9);
    }
  }
  if (bVar17 && uVar13 < 2) {
    Bignum::ShiftLeft(&local_440,1);
    Bignum::ShiftLeft(&local_23c,1);
    Bignum::ShiftLeft(&local_848,1);
  }
  iVar4 = Bignum::PlusCompare(&local_23c,&local_848,&local_440);
  uVar10 = (uint)((factor & 1) == 0);
  iVar9 = -uVar10;
  if (iVar4 == iVar9 || SBORROW4(iVar4,iVar9) != (int)(iVar4 + uVar10) < 0) {
    *length = uVar16;
    Bignum::MultiplyByUInt32(&local_23c,10);
    iVar9 = Bignum::Compare(&local_644,&local_848);
    Bignum::MultiplyByUInt32(&local_644,10);
    if (iVar9 == 0) {
      Bignum::AssignBignum(&local_848,&local_644);
    }
    else {
      Bignum::MultiplyByUInt32(&local_848,10);
    }
  }
  else {
    *length = uVar16 + 1;
  }
  if (uVar13 < 2) {
    iVar9 = Bignum::Compare(&local_644,&local_848);
    pBVar14 = &local_848;
    if (iVar9 == 0) {
      pBVar14 = &local_644;
    }
    *piVar15 = 0;
    uVar13 = (uint)factor & 1 ^ 1;
    iVar4 = -(uint)((factor & 1) == 0);
    do {
      uVar3 = Bignum::DivideModuloIntBignum(&local_23c,&local_440);
      iVar19 = *piVar15;
      *piVar15 = iVar19 + 1;
      pcVar11[iVar19] = (char)uVar3 + '0';
      iVar5 = Bignum::Compare(&local_23c,&local_644);
      iVar6 = Bignum::PlusCompare(&local_23c,pBVar14,&local_440);
      iVar19 = iVar4;
      if (iVar6 <= iVar4 && (int)uVar13 <= iVar5) {
        Bignum::MultiplyByUInt32(&local_23c,10);
        Bignum::MultiplyByUInt32(&local_644,10);
        if (iVar9 != 0) {
          Bignum::MultiplyByUInt32(pBVar14,10);
        }
      }
      else if ((iVar5 < (int)uVar13) && (iVar4 < iVar6)) {
        iVar7 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
        if (-1 < iVar7) {
          if ((iVar7 != 0) || ((pcVar11[(long)*piVar15 + -1] & 1U) != 0)) {
            pcVar11[(long)*piVar15 + -1] = pcVar11[(long)*piVar15 + -1] + 1;
          }
        }
      }
      else if ((int)uVar13 <= iVar5) {
        pcVar11[(long)*piVar15 + -1] = pcVar11[(long)*piVar15 + -1] + '\x01';
      }
      bVar17 = iVar6 <= iVar4;
      iVar4 = iVar19;
    } while (bVar17 && (int)uVar13 <= iVar5);
  }
  else if (uVar13 == 2) {
    BVar8 = -*length;
    if ((int)mode < (int)BVar8) {
      *length = -mode;
      *piVar15 = 0;
    }
    else {
      if (BVar8 != mode) {
        BVar8 = *length + mode;
        goto LAB_003e8f47;
      }
      Bignum::MultiplyByUInt32(&local_440,10);
      iVar9 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
      if (iVar9 < 0) {
        *piVar15 = 0;
      }
      else {
        *pcVar11 = '1';
        *piVar15 = 1;
        *length = *length + 1;
      }
    }
  }
  else {
    BVar8 = mode;
    if (uVar13 != 3) {
      abort();
    }
LAB_003e8f47:
    buffer_00._8_8_ = piVar15;
    buffer_00.start_ = pcVar11;
    GenerateCountedDigits
              (BVar8,length,&local_23c,&local_440,buffer_00,
               (int *)CONCAT44(mode,in_stack_fffffffffffff788));
  }
  pcVar11[*piVar15] = '\0';
LAB_003e90b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}